

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O3

Maybe<capnp::compiler::Module_&> __thiscall
capnp::compiler::ModuleLoader::Impl::loadModule(Impl *this,ReadableDirectory *dir,PathPtr path)

{
  _Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  _Hash_node_base *p_Var1;
  ReadableDirectory *pRVar2;
  __node_base_ptr p_Var3;
  ReadableFile *pRVar4;
  size_t sVar5;
  Impl *pIVar6;
  String *pSVar7;
  Maybe<const_kj::ReadableFile_&> MVar8;
  __node_ptr p_Var9;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>_>_>
  *this_01;
  ReadableDirectory *__s;
  __node_base_ptr p_Var10;
  String *pSVar11;
  String *pSVar12;
  void *__child_stack;
  __node_ptr __bkt;
  _func_int **pp_Var13;
  ulong uVar14;
  __node_ptr __n;
  _Hash_node_base *p_Var15;
  void *in_R8;
  ulong uVar16;
  ulong __c;
  undefined1 auVar17 [16];
  __buckets_alloc_type __alloc;
  OwnOwn<const_kj::ReadableFile,_std::nullptr_t> _file242;
  Path pathCopy;
  Own<capnp::compiler::ModuleLoader::ModuleImpl,_std::nullptr_t> module;
  new_allocator<std::__detail::_Hash_node_base_*> local_d9;
  Own<const_kj::ReadableFile,_std::nullptr_t> local_d8;
  String *local_c8;
  String *local_c0;
  Path local_b8;
  String *local_98;
  Impl *local_90;
  uint64_t local_88;
  size_t local_80;
  key_type local_78;
  String *local_40 [2];
  
  pSVar11 = (String *)path.parts.size_;
  pSVar12 = path.parts.ptr;
  this_00 = (_Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(dir + 5);
  local_78.file.ptr = (ReadableFile *)0x0;
  local_78.hashCode = 0;
  local_78.size = 0;
  local_78.lastModified.value.value = (Quantity<long,_kj::_::NanosecondLabel>)0;
  local_78.baseDir = (ReadableDirectory *)pSVar12;
  local_78.path.parts.ptr = pSVar11;
  local_40[0] = pSVar11;
  p_Var9 = std::
           _Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(this_00,0,&local_78,0);
  if (p_Var9 == (__node_ptr)0x0) {
    (**(_func_int **)((long)(pSVar12->content).ptr + 0x50))(&local_78,pSVar12,pSVar11);
    local_d8.disposer = (Disposer *)local_78.baseDir;
    local_d8.ptr = (ReadableFile *)local_78.path.parts.ptr;
    if (local_78.path.parts.ptr == (String *)0x0) {
      this->errorReporter = (GlobalErrorReporter *)0x0;
    }
    else {
      kj::PathPtr::clone((PathPtr *)&local_b8,(__fn *)local_40,__child_stack,
                         (int)local_78.path.parts.ptr,in_R8);
      sVar5 = local_b8.parts.size_;
      pSVar11 = local_b8.parts.ptr;
      pRVar4 = local_d8.ptr;
      local_90 = this;
      (**(code **)(((Array<char> *)&(local_d8.ptr)->super_FsNode)->ptr + 0x10))
                (&local_78,local_d8.ptr);
      MVar8.ptr = local_78.file.ptr;
      pSVar7 = local_78.path.parts.ptr;
      local_80 = sVar5;
      local_c8 = pSVar11;
      local_88 = local_78.size;
      kj::
      heap<capnp::compiler::ModuleLoader::ModuleImpl,capnp::compiler::ModuleLoader::Impl&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::ReadableDirectory_const&,kj::Path>
                ((kj *)&local_78,(Impl *)dir,&local_d8,(ReadableDirectory *)pSVar12,&local_b8);
      local_98 = (String *)local_78.baseDir;
      local_c0 = local_78.path.parts.ptr;
      local_78.path.parts.ptr = (String *)0x0;
      this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>_>_>
                 *)operator_new(0x58);
      *(undefined8 *)&this_01->field_0x0 = 0;
      *(String **)&this_01[8].field_0x0 = pSVar12;
      *(String **)&this_01[0x10].field_0x0 = local_c8;
      *(size_t *)&this_01[0x18].field_0x0 = local_80;
      *(ReadableFile **)&this_01[0x20].field_0x0 = pRVar4;
      *(uint64_t *)&this_01[0x28].field_0x0 = local_88;
      *(String **)&this_01[0x30].field_0x0 = pSVar7;
      *(ReadableFile **)&this_01[0x38].field_0x0 = MVar8.ptr;
      *(String **)&this_01[0x40].field_0x0 = local_98;
      *(String **)&this_01[0x48].field_0x0 = local_c0;
      __c = local_88 + (long)pSVar7 * 0x67 + (long)MVar8.ptr * 0x49;
      __bkt = (__node_ptr)(__c % (ulong)dir[6].super_FsNode._vptr_FsNode);
      __n = __bkt;
      p_Var9 = std::
               _Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_node(this_00,(size_type)__bkt,(key_type *)(this_01 + 8),__c);
      pIVar6 = local_90;
      if (p_Var9 == (__node_ptr)0x0) {
        local_c8 = (String *)dir[10].super_FsNode._vptr_FsNode;
        auVar17 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                            ((ulong)(dir + 9),(ulong)dir[6].super_FsNode._vptr_FsNode,
                             (ulong)dir[8].super_FsNode._vptr_FsNode);
        pp_Var13 = auVar17._8_8_;
        if ((auVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          __s = (ReadableDirectory *)this_00->_M_buckets;
        }
        else {
          if (pp_Var13 == (_func_int **)0x1) {
            __s = dir + 0xb;
            dir[0xb].super_FsNode._vptr_FsNode = (_func_int **)0x0;
          }
          else {
            __s = (ReadableDirectory *)
                  __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                            (&local_d9,(size_type)pp_Var13,(void *)0x0);
            memset(__s,0,(long)pp_Var13 * 8);
          }
          p_Var15 = (_Hash_node_base *)dir[7].super_FsNode._vptr_FsNode;
          dir[7].super_FsNode._vptr_FsNode = (_func_int **)0x0;
          if (p_Var15 != (_Hash_node_base *)0x0) {
            p_Var3 = (__node_base_ptr)(dir + 7);
            uVar16 = 0;
            do {
              p_Var1 = p_Var15->_M_nxt;
              uVar14 = (ulong)p_Var15[10]._M_nxt % (ulong)pp_Var13;
              p_Var10 = (__node_base_ptr)__s[uVar14].super_FsNode._vptr_FsNode;
              if (p_Var10 == (__node_base_ptr)0x0) {
                p_Var15->_M_nxt = p_Var3->_M_nxt;
                p_Var3->_M_nxt = p_Var15;
                __s[uVar14].super_FsNode._vptr_FsNode = (_func_int **)p_Var3;
                if (p_Var15->_M_nxt != (_Hash_node_base *)0x0) {
                  p_Var10 = (__node_base_ptr)(__s + uVar16);
                  goto LAB_00113fb0;
                }
              }
              else {
                p_Var15->_M_nxt = p_Var10->_M_nxt;
                p_Var10 = (__node_base_ptr)__s[uVar14].super_FsNode._vptr_FsNode;
                uVar14 = uVar16;
LAB_00113fb0:
                p_Var10->_M_nxt = p_Var15;
              }
              p_Var15 = p_Var1;
              uVar16 = uVar14;
            } while (p_Var1 != (_Hash_node_base *)0x0);
          }
          pRVar2 = (ReadableDirectory *)dir[5].super_FsNode._vptr_FsNode;
          if (dir + 0xb != pRVar2) {
            operator_delete(pRVar2,(long)dir[6].super_FsNode._vptr_FsNode << 3);
          }
          dir[6].super_FsNode._vptr_FsNode = pp_Var13;
          dir[5].super_FsNode._vptr_FsNode = (_func_int **)__s;
          __bkt = (__node_ptr)(__c % (ulong)pp_Var13);
        }
        *(ulong *)&this_01[0x50].field_0x0 = __c;
        p_Var3 = (__node_base_ptr)__s[(long)__bkt].super_FsNode._vptr_FsNode;
        if (p_Var3 == (__node_base_ptr)0x0) {
          pp_Var13 = dir[7].super_FsNode._vptr_FsNode;
          *(_func_int ***)&this_01->field_0x0 = pp_Var13;
          dir[7].super_FsNode._vptr_FsNode = (_func_int **)this_01;
          if (pp_Var13 != (_func_int **)0x0) {
            __s[(ulong)pp_Var13[10] % (ulong)dir[6].super_FsNode._vptr_FsNode].super_FsNode.
            _vptr_FsNode = (_func_int **)this_01;
            __s = (ReadableDirectory *)dir[5].super_FsNode._vptr_FsNode;
          }
          __s[(long)__bkt].super_FsNode._vptr_FsNode = (_func_int **)(dir + 7);
        }
        else {
          *(_Hash_node_base **)&this_01->field_0x0 = p_Var3->_M_nxt;
          ((__node_base_ptr)__s[(long)__bkt].super_FsNode._vptr_FsNode)->_M_nxt =
               (_Hash_node_base *)this_01;
        }
        dir[8].super_FsNode._vptr_FsNode =
             (_func_int **)((long)dir[8].super_FsNode._vptr_FsNode + 1);
        pSVar11 = local_c0;
      }
      else {
        std::__detail::
        _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>_>_>
        ::_M_deallocate_node(this_01,__n);
        pSVar11 = *(String **)
                   ((long)&(p_Var9->
                           super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
                           ._M_storage._M_storage + 0x40);
      }
      pSVar12 = local_78.path.parts.ptr;
      ((ErrorReporter *)&pIVar6->errorReporter)->_vptr_ErrorReporter = (_func_int **)pSVar11;
      if (local_78.path.parts.ptr != (String *)0x0) {
        local_78.path.parts.ptr = (String *)0x0;
        (**(_func_int **)((Array<char> *)&(local_78.baseDir)->super_FsNode)->ptr)
                  (local_78.baseDir,
                   (long)&(pSVar12->content).ptr + *(long *)((pSVar12->content).ptr + -0x10));
      }
      sVar5 = local_b8.parts.size_;
      pSVar11 = local_b8.parts.ptr;
      if (local_b8.parts.ptr != (String *)0x0) {
        local_b8.parts.ptr = (String *)0x0;
        local_b8.parts.size_ = 0;
        (**(local_b8.parts.disposer)->_vptr_ArrayDisposer)
                  (local_b8.parts.disposer,pSVar11,0x18,sVar5,sVar5,
                   kj::ArrayDisposer::Dispose_<kj::String>::destruct);
      }
      this = local_90;
      pRVar4 = local_d8.ptr;
      if ((String *)local_d8.ptr != (String *)0x0) {
        local_d8.ptr = (ReadableFile *)0x0;
        (**(_func_int **)((Array<char> *)&(local_d8.disposer)->_vptr_Disposer)->ptr)
                  (local_d8.disposer,
                   (long)&((Array<char> *)&pRVar4->super_FsNode)->ptr +
                   *(long *)(((Array<char> *)&pRVar4->super_FsNode)->ptr + -0x10));
      }
    }
  }
  else {
    this->errorReporter =
         *(GlobalErrorReporter **)
          ((long)&(p_Var9->
                  super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                  ).
                  super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
                  ._M_storage._M_storage + 0x40);
  }
  return (Maybe<capnp::compiler::Module_&>)(Module *)this;
}

Assistant:

kj::Maybe<Module&> ModuleLoader::Impl::loadModule(
    const kj::ReadableDirectory& dir, kj::PathPtr path) {
  auto iter = modules.find(FileKey(dir, path));
  if (iter != modules.end()) {
    // Return existing file.
    return *iter->second;
  }

  KJ_IF_SOME(file, dir.tryOpenFile(path)) {
    auto pathCopy = path.clone();
    auto key = FileKey(dir, pathCopy, *file);
    auto module = kj::heap<ModuleImpl>(*this, kj::mv(file), dir, kj::mv(pathCopy));
    auto& result = *module;
    auto insertResult = modules.insert(std::make_pair(key, kj::mv(module)));
    if (insertResult.second) {
      return result;
    } else {
      // Now that we have the file open, we noticed a collision. Return the old file.
      return *insertResult.first->second;
    }
  } else {
    // No such file.
    return kj::none;
  }